

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O3

unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
llvm::MemoryBuffer::getMemBufferCopy(StringRef InputData,Twine *BufferName)

{
  Twine *in_RCX;
  _func_int **local_30;
  unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> Buf;
  
  WritableMemoryBuffer::getNewUninitMemBuffer
            ((WritableMemoryBuffer *)&local_30,(size_t)BufferName,in_RCX);
  if (local_30 != (_func_int **)0x0) {
    memcpy(local_30[1],(void *)InputData.Length,(size_t)BufferName);
  }
  *(_func_int ***)InputData.Data = local_30;
  return (__uniq_ptr_data<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>,_true,_true>)
         (tuple<llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>)InputData.Data;
}

Assistant:

std::unique_ptr<MemoryBuffer>
MemoryBuffer::getMemBufferCopy(StringRef InputData, const Twine &BufferName) {
  auto Buf = getMemBufferCopyImpl(InputData, BufferName);
  if (Buf)
    return std::move(*Buf);
  return nullptr;
}